

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestUploadCommand::InitializeHandler(cmCTestUploadCommand *this)

{
  allocator<char> local_41;
  string local_40;
  cmCTestUploadCommand *local_20;
  cmCTestGenericHandler *handler;
  cmCTestUploadCommand *this_local;
  
  handler = (cmCTestGenericHandler *)this;
  local_20 = (cmCTestUploadCommand *)
             cmCTest::GetInitializedHandler
                       ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"upload");
  if (local_20 == (cmCTestUploadCommand *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"internal CTest error. Cannot instantiate upload handler",
               &local_41);
    cmCommand::SetError((cmCommand *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local = (cmCTestUploadCommand *)0x0;
  }
  else {
    cmCTestUploadHandler::SetFiles((cmCTestUploadHandler *)local_20,&this->Files);
    cmCTestGenericHandler::SetQuiet
              ((cmCTestGenericHandler *)local_20,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    this_local = local_20;
  }
  return (cmCTestGenericHandler *)this_local;
}

Assistant:

cmCTestGenericHandler* cmCTestUploadCommand::InitializeHandler()
{
  cmCTestGenericHandler* handler =
    this->CTest->GetInitializedHandler("upload");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate upload handler");
    return nullptr;
  }
  static_cast<cmCTestUploadHandler*>(handler)->SetFiles(this->Files);

  handler->SetQuiet(this->Quiet);
  return handler;
}